

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)38,_(unsigned_short)15>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint *puVar1;
  
  puVar1 = *in;
  out[0xf] = (ulong)puVar1[1] << 6 | (ulong)(*puVar1 >> 0x1a);
  *in = puVar1 + 2;
  Unroller<(unsigned_short)38,_(unsigned_short)16>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}